

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

long mem_seek(jas_stream_obj_t *obj,long offset,int origin)

{
  int iVar1;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("mem_seek(%p, %ld, %d)\n",obj,offset,(ulong)(uint)origin);
  }
  if (origin != 0) {
    if (origin == 1) {
      offset = offset + *(long *)((long)obj + 0x18);
    }
    else {
      if (origin != 2) {
        abort();
      }
      offset = *(long *)((long)obj + 0x10) - offset;
    }
  }
  if (offset < 0) {
    offset = -1;
  }
  else {
    *(long *)((long)obj + 0x18) = offset;
  }
  return offset;
}

Assistant:

static long mem_seek(jas_stream_obj_t *obj, long offset, int origin)
{
	jas_stream_memobj_t *m = (jas_stream_memobj_t *)obj;
	ssize_t newpos;

	JAS_DBGLOG(100, ("mem_seek(%p, %ld, %d)\n", obj, offset, origin));
	switch (origin) {
	case SEEK_SET:
		newpos = offset;
		break;
	case SEEK_END:
		newpos = m->len_ - offset;
		break;
	case SEEK_CUR:
		newpos = m->pos_ + offset;
		break;
	default:
		abort();
		break;
	}
	if (newpos < 0) {
		return -1;
	}
	m->pos_ = newpos;

	return m->pos_;
}